

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void kratos::set_var_params
               (Var *var,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
               *parameters)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Var *pVVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar5;
  Param *pPVar6;
  element_type *peVar7;
  element_type *peVar8;
  uint32_t index;
  undefined1 local_d0 [24];
  shared_ptr<kratos::Param> *parent_param_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>
  *iter_1;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *__range3;
  undefined8 uStack_90;
  bool found_1;
  uint64_t i;
  byte local_61;
  undefined1 local_60 [24];
  shared_ptr<kratos::Param> *parent_param;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>
  *iter;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *__range2;
  bool found;
  Var *param;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *parameters_local;
  Var *var_local;
  
  pVVar4 = Var::width_param(var);
  if (pVVar4 != (Var *)0x0) {
    bVar1 = false;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
             ::begin(parameters);
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
              ::end(parameters);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&iter), bVar2) {
      parent_param = (shared_ptr<kratos::Param> *)
                     std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
                     ::operator*(&__end2);
      local_60._16_8_ = &((reference)parent_param)->second;
      uVar3 = (*(pVVar4->super_IRNode)._vptr_IRNode[0x1b])();
      local_61 = 0;
      bVar2 = false;
      if ((uVar3 & 1) != 0) {
        Var::as<kratos::Param>((Var *)local_60);
        local_61 = 1;
        peVar7 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        pPVar6 = Param::parent_param(peVar7);
        peVar8 = std::__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2> *)
                            local_60._16_8_);
        bVar2 = pPVar6 == peVar8;
      }
      if ((local_61 & 1) != 0) {
        std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)local_60);
      }
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60._16_8_);
        Param::remove_param_width_var(peVar7,pVVar4);
        std::shared_ptr<kratos::Var>::shared_ptr<kratos::Param,void>
                  ((shared_ptr<kratos::Var> *)&i,(shared_ptr<kratos::Param> *)local_60._16_8_);
        Var::set_width_param(var,(shared_ptr<kratos::Var> *)&i);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&i);
        bVar1 = true;
        break;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
      ::operator++(&__end2);
    }
    if (!bVar1) {
      (*(var->super_IRNode)._vptr_IRNode[0x23])(var,0);
    }
  }
  uStack_90 = 0;
  do {
    this = Var::size(var);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
    if (sVar5 <= (ulong)uStack_90) {
      return;
    }
    index = (uint32_t)uStack_90;
    pVVar4 = Var::get_size_param(var,index);
    if (pVVar4 == (Var *)0x0) {
      Var::set_size_param(var,index,(Var *)0x0);
    }
    else {
      bVar1 = false;
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
               ::begin(parameters);
      iter_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                  ::end(parameters);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&iter_1), bVar2) {
        parent_param_1 =
             (shared_ptr<kratos::Param> *)
             std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
             ::operator*(&__end3);
        local_d0._16_8_ = &((reference)parent_param_1)->second;
        uVar3 = (*(pVVar4->super_IRNode)._vptr_IRNode[0x1b])();
        bVar2 = false;
        if ((uVar3 & 1) != 0) {
          Var::as<kratos::Param>((Var *)local_d0);
          peVar7 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d0);
          pPVar6 = Param::parent_param(peVar7);
          peVar8 = std::__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2> *)
                              local_d0._16_8_);
          bVar2 = pPVar6 == peVar8;
          std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)local_d0);
        }
        if (bVar2) {
          peVar7 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d0._16_8_);
          Param::remove_param_size_var(peVar7,var,index,pVVar4);
          peVar8 = std::__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2> *)
                              local_d0._16_8_);
          Var::set_size_param(var,index,(Var *)peVar8);
          bVar1 = true;
          break;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
        ::operator++(&__end3);
      }
      if (!bVar1) {
        Var::set_size_param(var,index,(Var *)0x0);
      }
    }
    uStack_90 = uStack_90 + 1;
  } while( true );
}

Assistant:

void set_var_params(Var *var, const std::map<std::string, std::shared_ptr<Param>> &parameters) {
    auto *param = var->width_param();
    if (param) {
        // brute force
        bool found = false;
        for (auto const &iter : parameters) {
            auto const &parent_param = iter.second;
            // for now, we only support exact match
            if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                // found it
                parent_param->remove_param_width_var(param);
                var->set_width_param(parent_param);
                found = true;
                break;
            }
        }
        if (!found) {
            var->set_width_param(nullptr);
        }
    }

    // size param as well
    for (uint64_t i = 0; i < var->size().size(); i++) {
        param = var->get_size_param(i);
        if (param) {
            // brute force
            bool found = false;
            for (auto const &iter : parameters) {
                auto const &parent_param = iter.second;
                // for now, we only support exact match
                if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                    // found it
                    parent_param->remove_param_size_var(var, i, param);
                    var->set_size_param(i, parent_param.get());
                    found = true;
                    break;
                }
            }
            if (!found) {
                var->set_size_param(i, nullptr);
            }
        } else {
            var->set_size_param(i, nullptr);
        }
    }
}